

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

void __thiscall ans_fold_decode<1U>::~ans_fold_decode(ans_fold_decode<1U> *this)

{
  std::_Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>::~_Vector_base
            (&(this->table).super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

static ans_fold_decode load(const uint8_t* in_u8)
    {
        ans_fold_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                uint32_t except_bytes = ans_fold_exception_bytes<fidelity>(sym);
                model.table[cur_base + k].mapped_num
                    = ans_fold_undo_mapping<fidelity>(sym)
                    + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }